

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int yaml_emitter_analyze_event(yaml_emitter_t *emitter,yaml_event_t *event)

{
  int iVar1;
  yaml_event_t *event_local;
  yaml_emitter_t *emitter_local;
  
  (emitter->anchor_data).anchor = (yaml_char_t *)0x0;
  (emitter->anchor_data).anchor_length = 0;
  (emitter->tag_data).handle = (yaml_char_t *)0x0;
  (emitter->tag_data).handle_length = 0;
  (emitter->tag_data).suffix = (yaml_char_t *)0x0;
  (emitter->tag_data).suffix_length = 0;
  (emitter->scalar_data).value = (yaml_char_t *)0x0;
  (emitter->scalar_data).length = 0;
  switch(event->type) {
  case YAML_ALIAS_EVENT:
    iVar1 = yaml_emitter_analyze_anchor(emitter,(event->data).scalar.anchor,1);
    if (iVar1 == 0) {
      emitter_local._4_4_ = 0;
    }
    else {
      emitter_local._4_4_ = 1;
    }
    break;
  case YAML_SCALAR_EVENT:
    if (((event->data).document_start.version_directive == (yaml_version_directive_t *)0x0) ||
       (iVar1 = yaml_emitter_analyze_anchor(emitter,(event->data).scalar.anchor,0), iVar1 != 0)) {
      if ((((event->data).document_start.tag_directives.start == (yaml_tag_directive_t *)0x0) ||
          ((emitter->canonical == 0 &&
           (((event->data).scalar.plain_implicit != 0 || ((event->data).scalar.quoted_implicit != 0)
            ))))) ||
         (iVar1 = yaml_emitter_analyze_tag(emitter,(event->data).scalar.tag), iVar1 != 0)) {
        iVar1 = yaml_emitter_analyze_scalar
                          (emitter,(event->data).scalar.value,(event->data).scalar.length);
        if (iVar1 == 0) {
          emitter_local._4_4_ = 0;
        }
        else {
          emitter_local._4_4_ = 1;
        }
      }
      else {
        emitter_local._4_4_ = 0;
      }
    }
    else {
      emitter_local._4_4_ = 0;
    }
    break;
  case YAML_SEQUENCE_START_EVENT:
    if (((event->data).document_start.version_directive == (yaml_version_directive_t *)0x0) ||
       (iVar1 = yaml_emitter_analyze_anchor(emitter,(event->data).scalar.anchor,0), iVar1 != 0)) {
      if ((((event->data).document_start.tag_directives.start == (yaml_tag_directive_t *)0x0) ||
          ((emitter->canonical == 0 && ((event->data).sequence_start.implicit != 0)))) ||
         (iVar1 = yaml_emitter_analyze_tag(emitter,(event->data).scalar.tag), iVar1 != 0)) {
        emitter_local._4_4_ = 1;
      }
      else {
        emitter_local._4_4_ = 0;
      }
    }
    else {
      emitter_local._4_4_ = 0;
    }
    break;
  default:
    emitter_local._4_4_ = 1;
    break;
  case YAML_MAPPING_START_EVENT:
    if (((event->data).document_start.version_directive == (yaml_version_directive_t *)0x0) ||
       (iVar1 = yaml_emitter_analyze_anchor(emitter,(event->data).scalar.anchor,0), iVar1 != 0)) {
      if (((event->data).document_start.tag_directives.start == (yaml_tag_directive_t *)0x0) ||
         (((emitter->canonical == 0 && ((event->data).sequence_start.implicit != 0)) ||
          (iVar1 = yaml_emitter_analyze_tag(emitter,(event->data).scalar.tag), iVar1 != 0)))) {
        emitter_local._4_4_ = 1;
      }
      else {
        emitter_local._4_4_ = 0;
      }
    }
    else {
      emitter_local._4_4_ = 0;
    }
  }
  return emitter_local._4_4_;
}

Assistant:

static int
yaml_emitter_analyze_event(yaml_emitter_t *emitter,
        yaml_event_t *event)
{
    emitter->anchor_data.anchor = NULL;
    emitter->anchor_data.anchor_length = 0;
    emitter->tag_data.handle = NULL;
    emitter->tag_data.handle_length = 0;
    emitter->tag_data.suffix = NULL;
    emitter->tag_data.suffix_length = 0;
    emitter->scalar_data.value = NULL;
    emitter->scalar_data.length = 0;

    switch (event->type)
    {
        case YAML_ALIAS_EVENT:
            if (!yaml_emitter_analyze_anchor(emitter,
                        event->data.alias.anchor, 1))
                return 0;
            return 1;

        case YAML_SCALAR_EVENT:
            if (event->data.scalar.anchor) {
                if (!yaml_emitter_analyze_anchor(emitter,
                            event->data.scalar.anchor, 0))
                    return 0;
            }
            if (event->data.scalar.tag && (emitter->canonical ||
                        (!event->data.scalar.plain_implicit
                         && !event->data.scalar.quoted_implicit))) {
                if (!yaml_emitter_analyze_tag(emitter, event->data.scalar.tag))
                    return 0;
            }
            if (!yaml_emitter_analyze_scalar(emitter,
                        event->data.scalar.value, event->data.scalar.length))
                return 0;
            return 1;

        case YAML_SEQUENCE_START_EVENT:
            if (event->data.sequence_start.anchor) {
                if (!yaml_emitter_analyze_anchor(emitter,
                            event->data.sequence_start.anchor, 0))
                    return 0;
            }
            if (event->data.sequence_start.tag && (emitter->canonical ||
                        !event->data.sequence_start.implicit)) {
                if (!yaml_emitter_analyze_tag(emitter,
                            event->data.sequence_start.tag))
                    return 0;
            }
            return 1;

        case YAML_MAPPING_START_EVENT:
            if (event->data.mapping_start.anchor) {
                if (!yaml_emitter_analyze_anchor(emitter,
                            event->data.mapping_start.anchor, 0))
                    return 0;
            }
            if (event->data.mapping_start.tag && (emitter->canonical ||
                        !event->data.mapping_start.implicit)) {
                if (!yaml_emitter_analyze_tag(emitter,
                            event->data.mapping_start.tag))
                    return 0;
            }
            return 1;

        default:
            return 1;
    }
}